

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halftest.cpp
# Opt level: O0

int overflowtest(float f)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  float in_XMM0_Da;
  float fVar6;
  int e;
  int i;
  uint32_t fi;
  int local_4;
  
  uVar2 = floatToBits(in_XMM0_Da);
  uVar1 = f2h(0.0);
  uVar3 = uVar2 >> 0x10 & 0x8000;
  uVar4 = uVar3 | 0x7c00;
  if (uVar1 == uVar4) {
    local_4 = 0;
  }
  else {
    fVar6 = h2f(0);
    pcVar5 = "";
    if (uVar3 != 0) {
      pcVar5 = "-";
    }
    printf("error: %g->0x%x->%g, expected 0x%x->%sinf\n",(double)in_XMM0_Da,(double)fVar6,
           (ulong)(uint)uVar1,(ulong)uVar4,pcVar5);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int overflowtest(float f)
{
    uint32_t fi = floatToBits(f);
    int i = f2h(f);
    int e = 0x7c00 | ((fi>>16)&0x8000);
    if (i != e) {
        printf("error: %g->0x%x->%g, expected 0x%x->%sinf\n",
               f, i, h2f(i), e, (e&0x8000) ? "-" : "");
        return 1;
    }
    return 0;
}